

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O0

optional<NFastBernoulli::TExecutionPlan> *
NFastBernoulli::Quantize
          (optional<NFastBernoulli::TExecutionPlan> *__return_storage_ptr__,double prob,double tol)

{
  iterator pvVar1;
  iterator pvVar2;
  double mid;
  iterator it;
  double rhs;
  double lhs;
  TExecutionPlan plan;
  double tol_local;
  double prob_local;
  
  plan.NoSrcBlocks_ = (size_t)tol;
  memset(&lhs,0,0x50);
  plan.NoOps_ = 1;
  rhs = 0.0;
  it = (iterator)0x3ff0000000000000;
  mid = (double)std::array<NFastBernoulli::EOp,_64UL>::begin
                          ((array<NFastBernoulli::EOp,_64UL> *)&lhs);
  tol_local = prob;
  while( true ) {
    pvVar1 = std::array<NFastBernoulli::EOp,_64UL>::end((array<NFastBernoulli::EOp,_64UL> *)&lhs);
    if (pvVar1 <= (iterator)((long)mid + 1U)) {
      std::optional<NFastBernoulli::TExecutionPlan>::optional(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if ((tol_local - rhs <= (double)plan.NoSrcBlocks_) &&
       ((double)it - tol_local <= (double)plan.NoSrcBlocks_)) break;
    pvVar1 = (iterator)(((double)it - rhs) * 0.5 + rhs);
    if (((double)pvVar1 == tol_local) && (!NAN((double)pvVar1) && !NAN(tol_local))) {
      pvVar1 = std::array<NFastBernoulli::EOp,_64UL>::begin
                         ((array<NFastBernoulli::EOp,_64UL> *)&lhs);
      pvVar2 = std::array<NFastBernoulli::EOp,_64UL>::begin
                         ((array<NFastBernoulli::EOp,_64UL> *)&lhs);
      std::reverse<NFastBernoulli::EOp*>(pvVar1,pvVar2 + plan.Ops_._M_elems._56_8_);
      std::optional<NFastBernoulli::TExecutionPlan>::optional<NFastBernoulli::TExecutionPlan,_true>
                (__return_storage_ptr__,(TExecutionPlan *)&lhs);
      return __return_storage_ptr__;
    }
    if (tol_local <= (double)pvVar1) {
      if (tol_local < (double)pvVar1) {
        it = pvVar1;
      }
    }
    else {
      *(undefined1 *)mid = 0;
      plan.Ops_._M_elems._56_8_ = plan.Ops_._M_elems._56_8_ + 1;
      tol_local = 1.0 - tol_local;
      rhs = 1.0 - (double)it;
      mid = (double)((long)mid + 1);
      it = (iterator)(1.0 - (double)pvVar1);
    }
    *(undefined1 *)mid = 1;
    plan.Ops_._M_elems._56_8_ = plan.Ops_._M_elems._56_8_ + 1;
    plan.NoOps_ = plan.NoOps_ + 1;
    mid = (double)((long)mid + 1);
  }
  pvVar1 = std::array<NFastBernoulli::EOp,_64UL>::begin((array<NFastBernoulli::EOp,_64UL> *)&lhs);
  pvVar2 = std::array<NFastBernoulli::EOp,_64UL>::begin((array<NFastBernoulli::EOp,_64UL> *)&lhs);
  std::reverse<NFastBernoulli::EOp*>(pvVar1,pvVar2 + plan.Ops_._M_elems._56_8_);
  std::optional<NFastBernoulli::TExecutionPlan>::optional<NFastBernoulli::TExecutionPlan,_true>
            (__return_storage_ptr__,(TExecutionPlan *)&lhs);
  return __return_storage_ptr__;
}

Assistant:

std::optional<TExecutionPlan> Quantize(double prob, double tol) noexcept {
    TExecutionPlan plan{.NoSrcBlocks_ = 1};
    double lhs = 0.0, rhs = 1.0;
    for (auto it = plan.Ops_.begin(); it + 1 < plan.Ops_.end(); ++it) {
        if (prob - lhs <= tol && rhs - prob <= tol) {
            std::reverse(plan.Ops_.begin(), plan.Ops_.begin() + plan.NoOps_);
            return plan;
        }

        double mid = lhs + 0.5 * (rhs - lhs);

        if (mid == prob) {
            std::reverse(plan.Ops_.begin(), plan.Ops_.begin() + plan.NoOps_);
            return plan;
        } else if (prob > mid) {
            *(it++) = EOp::Not;
            ++plan.NoOps_;
            prob = 1 - prob;
            lhs = 1 - rhs;
            rhs = 1 - mid;
        } else if (prob < mid) {
            rhs = mid;
        }

        // In any case append AND operation.
        *it = EOp::And;
        ++plan.NoOps_;
        ++plan.NoSrcBlocks_;
    }
    return std::nullopt;
}